

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeProg * __thiscall Parser::CreateProgNode(Parser *this,bool isModuleSource,ULONG lineNumber)

{
  ParseNodeType *pPVar1;
  size_t sVar2;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,isModuleSource) == 0) {
    pPVar1 = (ParseNodeType *)CreateNodeForOpT<(OpCode)87>(this);
  }
  else {
    pPVar1 = CreateNodeForOpT<(OpCode)88>(this);
    (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.super_ParseNode.nop = knopProg;
  }
  sVar2 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
  (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.cbMin = sVar2;
  (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.cbStringMin = sVar2;
  (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.cbStringLim =
       (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.cbLim;
  (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.lineNumber = lineNumber;
  (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.homeObjLocation = 0xffffffff;
  (pPVar1->super_ParseNodeProg).super_ParseNodeFnc.superRestrictionState = Disallowed;
  return &pPVar1->super_ParseNodeProg;
}

Assistant:

ParseNodeProg * Parser::CreateProgNode(bool isModuleSource, ULONG lineNumber)
{
    ParseNodeProg * pnodeProg;

    if (isModuleSource)
    {
        pnodeProg = CreateNodeForOpT<knopModule>();

        // knopModule is not actually handled anywhere since we would need to handle it everywhere we could
        // have knopProg and it would be treated exactly the same except for import/export statements.
        // We are only using it as a way to get the correct size for PnModule.
        // Consider: Should we add a flag to PnProg which is false but set to true in PnModule?
        //           If we do, it can't be a virtual method since the parse nodes are all in a union.
        pnodeProg->nop = knopProg;
    }
    else
    {
        pnodeProg = CreateNodeForOpT<knopProg>();
    }

    pnodeProg->cbMin = this->GetScanner()->IecpMinTok();
    pnodeProg->cbStringMin = pnodeProg->cbMin;
    pnodeProg->cbStringLim = pnodeProg->cbLim;
    pnodeProg->lineNumber = lineNumber;
    pnodeProg->homeObjLocation = Js::Constants::NoRegister;
    pnodeProg->superRestrictionState = SuperRestrictionState::Disallowed;
    return pnodeProg;
}